

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
perfetto::protos::gen::PerfEventConfig_Scope::SerializeAsArray
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PerfEventConfig_Scope *this)

{
  HeapBuffered<protozero::Message> msg;
  HeapBuffered<protozero::Message> local_d0;
  
  protozero::HeapBuffered<protozero::Message>::HeapBuffered(&local_d0);
  Serialize(this,&local_d0.msg_.super_Message);
  protozero::HeapBuffered<protozero::Message>::SerializeAsArray(__return_storage_ptr__,&local_d0);
  protozero::MessageArena::~MessageArena(&local_d0.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_d0.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_d0.shb_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> PerfEventConfig_Scope::SerializeAsArray() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsArray();
}